

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::
         do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  int iVar1;
  locale_ref loc_00;
  char cVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  appender aVar6;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  undefined2 uStack_108;
  char local_106;
  char zero;
  bool pointy;
  undefined3 uStack_103;
  int significand_size;
  sign_t sign;
  ulong local_f8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_f0;
  basic_format_specs<char> *local_e8;
  locale_ref local_e0;
  char *significand;
  int local_d0;
  int exp;
  ulong local_c8;
  char *local_c0;
  float_specs fspecs_local;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = fp->significand;
  iVar1 = fp->significand_size;
  zero = '0';
  uVar4 = fspecs._4_4_;
  sign = uVar4 >> 8 & 0xff;
  local_f8 = (ulong)((uint)(sign != none) + iVar1);
  cVar2 = '.';
  significand_size = iVar1;
  local_f0 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_e8 = specs;
  local_e0.locale_ = loc.locale_;
  local_c0 = significand;
  fspecs_local = fspecs;
  if ((uVar4 >> 0x11 & 1) != 0) {
    loc_00.locale_._2_1_ = local_106;
    loc_00.locale_._0_2_ = uStack_108;
    loc_00.locale_._3_1_ = 0x30;
    loc_00.locale_._4_4_ = _pointy;
    cVar2 = decimal_point_impl<char>(loc_00);
  }
  local_c8 = (ulong)(uint)fp->exponent;
  local_d0 = fp->exponent + iVar1 + -1;
  local_106 = cVar2;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_d0;
  bVar3 = do_write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char,_fmt::v8::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  iVar11 = fspecs.precision;
  if (bVar3) {
    if ((uVar4 >> 0x14 & 1) == 0) {
      uVar5 = 0;
      uVar9 = local_f8;
      if (iVar1 == 1) {
        cVar2 = '\0';
      }
    }
    else {
      uVar5 = 0;
      if (0 < iVar11 - iVar1) {
        uVar5 = (ulong)(uint)(iVar11 - iVar1);
      }
      uVar9 = local_f8 + uVar5;
    }
    write._0_8_ = CONCAT44(write._4_4_,uVar4 >> 8) & 0xffffffff000000ff;
    write.significand = local_c0;
    write.decimal_point = cVar2;
    write.significand_size = iVar1;
    write._24_5_ = CONCAT14('0',(int)uVar5);
    write._24_8_ = CONCAT26(write._30_2_,CONCAT15(((uVar4 >> 0x10 & 1) == 0) << 5,write._24_5_)) |
                   0x450000000000;
    write.output_exp = local_d0;
    if (0 < local_e8->width) {
      iVar11 = local_d0;
      if (iVar1 + (int)local_c8 < 1) {
        iVar11 = 1 - (iVar1 + (int)local_c8);
      }
      lVar10 = 2;
      if (99 < iVar11) {
        lVar10 = (ulong)(999 < iVar11) + 3;
      }
      aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                        ((appender)local_f0.container,local_e8,
                         uVar9 + (3 - (ulong)(cVar2 == '\0')) + lVar10,&write);
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    aVar6 = do_write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char,_fmt::v8::detail::digit_grouping<char>_>
            ::anon_class_40_8_dbbf3351::operator()(&write,(iterator)local_f0.container);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  iVar8 = fp->exponent;
  exp = iVar1 + iVar8;
  if ((long)iVar8 < 0) {
    if (exp < 1) {
      iVar8 = -exp;
      grouping.sep_.grouping._M_dataplus._M_p._0_4_ = iVar8;
      if (SBORROW4(iVar11,iVar8) != iVar11 + exp < 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = iVar11;
      }
      if (iVar11 < 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = iVar8;
      }
      if (iVar1 != 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = iVar8;
      }
      if (iVar1 == 0 && (int)grouping.sep_.grouping._M_dataplus._M_p == 0) {
        _pointy = CONCAT31(uStack_103,(char)((uVar4 & 0x100000) >> 0x14));
        if (((ulong)fspecs & 0x10000000000000) == 0) {
          iVar1 = 1;
          goto LAB_0013a8c4;
        }
      }
      else {
        _pointy = CONCAT31(uStack_103,1);
      }
      iVar1 = 2;
LAB_0013a8c4:
      write._0_8_ = &sign;
      write.significand = &zero;
      write._16_8_ = &pointy;
      write._24_8_ = &local_106;
      write._32_8_ = &grouping;
      aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>
                        ((appender)local_f0.container,local_e8,
                         (uint)(iVar1 + (int)grouping.sep_.grouping._M_dataplus._M_p) + local_f8,
                         (anon_class_56_7_162c6e41 *)&write);
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    uVar12 = iVar11 - iVar1 & (int)(uVar4 << 0xb) >> 0x1f;
    _pointy = uVar12;
    digit_grouping<char>::digit_grouping(&grouping,local_e0,(bool)((byte)(uVar4 >> 0x11) & 1));
    uVar4 = digit_grouping<char>::count_separators(&grouping,significand_size);
    uVar5 = 0;
    if (0 < (int)uVar12) {
      uVar5 = (ulong)uVar12;
    }
    write._0_8_ = &sign;
    write.significand = (char *)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = &exp;
    write._32_8_ = &local_106;
    bVar7.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>
                   (local_f0.container,local_e8,(ulong)uVar4 + uVar5 + local_f8 + 1,
                    (anon_class_64_8_e6ffa566 *)&write);
    goto LAB_0013a85e;
  }
  lVar10 = (long)iVar8 + local_f8;
  _pointy = iVar11 - exp;
  uVar5 = (ulong)_pointy;
  if ((uVar4 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)_pointy) {
      if ((int)_pointy < 1) goto LAB_0013a7d3;
    }
    else {
      _pointy = 1;
      uVar5 = 1;
    }
    lVar10 = lVar10 + uVar5 + 1;
  }
LAB_0013a7d3:
  digit_grouping<char>::digit_grouping(&grouping,local_e0,(bool)((byte)(uVar4 >> 0x11) & 1));
  uVar4 = digit_grouping<char>::count_separators(&grouping,significand_size);
  write._0_8_ = &sign;
  write.significand = (char *)&significand;
  write._16_8_ = &significand_size;
  write._24_8_ = fp;
  write._32_8_ = &grouping;
  bVar7.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>
                 (local_f0.container,local_e8,lVar10 + (ulong)uVar4,
                  (anon_class_72_9_d68ba176 *)&write);
LAB_0013a85e:
  std::__cxx11::string::~string((string *)&grouping);
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar7.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}